

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

undefined8 __thiscall svg::Polygon::toString_abi_cxx11_(Polygon *this,Layout *layout)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  Layout *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  double dVar5;
  Layout *in_stack_000000a0;
  Stroke *in_stack_000000a8;
  uint i;
  stringstream ss;
  string *in_stack_fffffffffffffd68;
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  uint local_1f8;
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [272];
  Layout *in_stack_ffffffffffffff80;
  Fill *in_stack_ffffffffffffff88;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"polygon",&local_1e1);
  elemStart(in_stack_fffffffffffffd68);
  std::operator<<(local_190,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::operator<<(local_190,"points=\"");
  local_1f8 = 0;
  while( true ) {
    uVar1 = (ulong)local_1f8;
    sVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::size
                      ((vector<svg::Point,_std::allocator<svg::Point>_> *)(in_RSI + 0x58));
    if (sVar2 <= uVar1) break;
    poVar4 = local_190;
    pvVar3 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                       ((vector<svg::Point,_std::allocator<svg::Point>_> *)(in_RSI + 0x58),
                        (ulong)local_1f8);
    dVar5 = translateX(pvVar3->x,in_RDX);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
    poVar4 = std::operator<<(poVar4,",");
    pvVar3 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                       ((vector<svg::Point,_std::allocator<svg::Point>_> *)(in_RSI + 0x58),
                        (ulong)local_1f8);
    dVar5 = translateY(pvVar3->y,in_RDX);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
    std::operator<<(poVar4," ");
    local_1f8 = local_1f8 + 1;
  }
  std::operator<<(local_190,"\" ");
  Fill::toString_abi_cxx11_(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  poVar4 = std::operator<<(local_190,local_218);
  Stroke::toString_abi_cxx11_(in_stack_000000a8,in_stack_000000a0);
  poVar4 = std::operator<<(poVar4,local_238);
  emptyElemEnd_abi_cxx11_();
  std::operator<<(poVar4,local_258);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("polygon");

            ss << "points=\"";
            for (unsigned i = 0; i < points.size(); ++i)
                ss << translateX(points[i].x, layout) << "," << translateY(points[i].y, layout) << " ";
            ss << "\" ";

            ss << fill.toString(layout) << stroke.toString(layout) << emptyElemEnd();
            return ss.str();
        }